

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlElement::SetAttribute(TiXmlElement *this,char *name,int val)

{
  char local_68 [8];
  char buf [64];
  int val_local;
  char *name_local;
  TiXmlElement *this_local;
  
  snprintf(local_68,0x40,"%d",(ulong)(uint)val);
  SetAttribute(this,name,local_68);
  return;
}

Assistant:

void TiXmlElement::SetAttribute(const char * name, int val) {
	char buf[64];
#if defined(TIXML_SNPRINTF)
	TIXML_SNPRINTF(buf, sizeof(buf), "%d", val);
#else
	sprintf( buf, "%d", val );
#endif
	SetAttribute(name, buf);
}